

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O3

void __thiscall
iDynTree::optimalcontrol::L2NormCost::L2NormCost
          (L2NormCost *this,string *name,IndexRange *stateSelector,uint totalStateDimension,
          IndexRange *controlSelector,uint totalControlDimension)

{
  char cVar1;
  L2NormCostImplementation *this_00;
  
  Cost::Cost(&this->super_Cost,name);
  (this->super_Cost)._vptr_Cost = (_func_int **)&PTR__L2NormCost_00199fc0;
  this_00 = (L2NormCostImplementation *)operator_new(0x250);
  CostAttributes::CostAttributes((CostAttributes *)this_00);
  CostAttributes::CostAttributes(&this_00->controlCost);
  this->m_pimpl = this_00;
  cVar1 = iDynTree::IndexRange::isValid();
  if (cVar1 == '\x01' && totalStateDimension != 0) {
    CostAttributes::initializeCost(&this->m_pimpl->stateCost,stateSelector,totalStateDimension);
  }
  cVar1 = iDynTree::IndexRange::isValid();
  if (cVar1 == '\x01' && totalControlDimension != 0) {
    CostAttributes::initializeCost
              (&this->m_pimpl->controlCost,controlSelector,totalControlDimension);
  }
  return;
}

Assistant:

L2NormCost::L2NormCost(const std::string &name, const IndexRange &stateSelector, unsigned int totalStateDimension, const IndexRange &controlSelector, unsigned int totalControlDimension)
            : Cost (name)
            , m_pimpl(new L2NormCostImplementation)
        {
            if (stateSelector.isValid() && totalStateDimension > 0) {
                m_pimpl->stateCost.initializeCost(stateSelector, totalStateDimension);

            }

            if (controlSelector.isValid() && totalControlDimension > 0) {
                m_pimpl->controlCost.initializeCost(controlSelector, totalControlDimension);

            }
        }